

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::PausableReadAsyncIoStream::PausableRead>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::PausableReadAsyncIoStream::PausableRead>,kj::_::PromiseDisposer,kj::PausableReadAsyncIoStream&,void*&,unsigned_long&,unsigned_long&>
          (PromiseDisposer *this,PausableReadAsyncIoStream *params,void **params_1,
          unsigned_long *params_2,unsigned_long *params_3)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  AdapterPromiseNode<unsigned_long,kj::PausableReadAsyncIoStream::PausableRead>::
  AdapterPromiseNode<kj::PausableReadAsyncIoStream&,void*&,unsigned_long&,unsigned_long&>
            ((AdapterPromiseNode<unsigned_long,kj::PausableReadAsyncIoStream::PausableRead> *)
             ((long)pvVar1 + 0x200),params,params_1,params_2,params_3);
  *(void **)((long)pvVar1 + 0x208) = pvVar1;
  *(AdapterPromiseNode<unsigned_long,kj::PausableReadAsyncIoStream::PausableRead> **)this =
       (AdapterPromiseNode<unsigned_long,kj::PausableReadAsyncIoStream::PausableRead> *)
       ((long)pvVar1 + 0x200);
  return (Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::PausableReadAsyncIoStream::PausableRead>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<unsigned_long,_kj::PausableReadAsyncIoStream::PausableRead> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }